

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

char * fmt::v10::detail::
       parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,void*,short,std::__cxx11::string>&>
                 (char *begin,char *end,
                 format_string_checker<char,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *handler)

{
  char cVar1;
  int id;
  char *begin_00;
  id_adapter adapter;
  id_adapter local_28;
  
  begin_00 = begin + 1;
  if (begin_00 == end) {
    throw_format_error("invalid format string");
  }
  cVar1 = *begin_00;
  if (cVar1 != '{') {
    if (cVar1 == '}') {
      id = compile_parse_context<char>::next_arg_id(&handler->context_);
    }
    else {
      local_28.arg_id = 0;
      local_28.handler = handler;
      if (cVar1 == ':') {
        local_28.arg_id = compile_parse_context<char>::next_arg_id(&handler->context_);
      }
      else {
        begin_00 = do_parse_arg_id<char,fmt::v10::detail::parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,void*,short,std::__cxx11::string>&>(char_const*,char_const*,fmt::v10::detail::format_string_checker<char,void*,short,std::__cxx11::string>&)::id_adapter&>
                             (begin_00,end,&local_28);
      }
      if (begin_00 == end) {
LAB_001903ec:
        throw_format_error("missing \'}\' in format string");
      }
      if (*begin_00 == ':') {
        begin_00 = format_string_checker<char,_void_*,_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::on_format_specs((format_string_checker<char,_void_*,_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)handler,local_28.arg_id,begin_00 + 1,end);
        if ((begin_00 == end) || (*begin_00 != '}')) {
          throw_format_error("unknown format specifier");
        }
        goto LAB_001903d0;
      }
      id = local_28.arg_id;
      if (*begin_00 != '}') goto LAB_001903ec;
    }
    format_string_checker<char,_void_*,_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::on_replacement_field(handler,id,begin_00);
  }
LAB_001903d0:
  return begin_00 + 1;
}

Assistant:

FMT_CONSTEXPR auto parse_replacement_field(const Char* begin, const Char* end,
                                           Handler&& handler) -> const Char* {
  struct id_adapter {
    Handler& handler;
    int arg_id;

    FMT_CONSTEXPR void on_auto() { arg_id = handler.on_arg_id(); }
    FMT_CONSTEXPR void on_index(int id) { arg_id = handler.on_arg_id(id); }
    FMT_CONSTEXPR void on_name(basic_string_view<Char> id) {
      arg_id = handler.on_arg_id(id);
    }
  };

  ++begin;
  if (begin == end) return handler.on_error("invalid format string"), end;
  if (*begin == '}') {
    handler.on_replacement_field(handler.on_arg_id(), begin);
  } else if (*begin == '{') {
    handler.on_text(begin, begin + 1);
  } else {
    auto adapter = id_adapter{handler, 0};
    begin = parse_arg_id(begin, end, adapter);
    Char c = begin != end ? *begin : Char();
    if (c == '}') {
      handler.on_replacement_field(adapter.arg_id, begin);
    } else if (c == ':') {
      begin = handler.on_format_specs(adapter.arg_id, begin + 1, end);
      if (begin == end || *begin != '}')
        return handler.on_error("unknown format specifier"), end;
    } else {
      return handler.on_error("missing '}' in format string"), end;
    }
  }
  return begin + 1;
}